

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize_avx2.c
# Opt level: O0

void av1_quantize_fp_64x64_avx2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan_ptr,
               int16_t *iscan_ptr)

{
  __m256i eob;
  uint16_t uVar1;
  long in_RSI;
  long in_stack_00000008;
  __m256i thr;
  __m256i qp [3];
  uint step;
  int log_scale;
  __m256i *in_stack_fffffffffffffea8;
  undefined8 uVar2;
  longlong in_stack_fffffffffffffee0;
  __m256i *in_stack_fffffffffffffee8;
  __m256i *in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffefc;
  int16_t *in_stack_ffffffffffffff00;
  int16_t *in_stack_ffffffffffffff08;
  int16_t *in_stack_ffffffffffffff10;
  long local_70;
  
  uVar2 = 0;
  init_qp(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
          in_stack_fffffffffffffefc,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  quantize_fp_64x64((__m256i *)qp[2][2],(__m256i *)qp[2][1],(tran_low_t *)qp[2][0],
                    (int16_t *)qp[1][3],(tran_low_t *)qp[1][2],(tran_low_t *)qp[1][1],
                    in_stack_fffffffffffffea8);
  in_stack_00000008 = in_stack_00000008 + 0x40;
  update_qp((__m256i *)&stack0xfffffffffffffee0,(__m256i *)&stack0xffffffffffffff00);
  for (local_70 = in_RSI + -0x10; 0 < local_70; local_70 = local_70 + -0x10) {
    quantize_fp_64x64((__m256i *)qp[2][2],(__m256i *)qp[2][1],(tran_low_t *)qp[2][0],
                      (int16_t *)qp[1][3],(tran_low_t *)qp[1][2],(tran_low_t *)qp[1][1],
                      in_stack_fffffffffffffea8);
    in_stack_00000008 = in_stack_00000008 + 0x40;
  }
  eob[1] = in_stack_fffffffffffffee0;
  eob[0] = uVar2;
  eob[2] = (longlong)in_stack_fffffffffffffee8;
  eob[3] = (longlong)in_stack_fffffffffffffef0;
  uVar1 = quant_gather_eob(eob);
  *dequant_ptr = uVar1;
  return;
}

Assistant:

void av1_quantize_fp_64x64_avx2(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan_ptr, const int16_t *iscan_ptr) {
  (void)scan_ptr;
  (void)zbin_ptr;
  (void)quant_shift_ptr;

  const int log_scale = 2;
  const unsigned int step = 16;
  __m256i qp[3], thr;
  __m256i eob = _mm256_setzero_si256();

  init_qp(round_ptr, quant_ptr, dequant_ptr, log_scale, &thr, qp);

  quantize_fp_64x64(&thr, qp, coeff_ptr, iscan_ptr, qcoeff_ptr, dqcoeff_ptr,
                    &eob);

  coeff_ptr += step;
  qcoeff_ptr += step;
  dqcoeff_ptr += step;
  iscan_ptr += step;
  n_coeffs -= step;

  update_qp(&thr, qp);

  while (n_coeffs > 0) {
    quantize_fp_64x64(&thr, qp, coeff_ptr, iscan_ptr, qcoeff_ptr, dqcoeff_ptr,
                      &eob);

    coeff_ptr += step;
    qcoeff_ptr += step;
    dqcoeff_ptr += step;
    iscan_ptr += step;
    n_coeffs -= step;
  }
  *eob_ptr = quant_gather_eob(eob);
}